

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NetDeclarationSyntax *pNVar1;
  Token TVar2;
  Token TVar3;
  TimingControlSyntax **in_stack_00000010;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_00000018;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000020;
  BumpAllocator *in_stack_000000b8;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_000000c0;
  BumpAllocator *in_stack_ffffffffffffff68;
  DataTypeSyntax *in_stack_ffffffffffffff70;
  NetStrengthSyntax *local_68;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            (in_stack_00000020,(BumpAllocator *)in_stack_00000018);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_000000c0,in_stack_000000b8);
  if (*(long *)(__fn + 0x60) == 0) {
    local_68 = (NetStrengthSyntax *)0x0;
  }
  else {
    local_68 = deepClone<slang::syntax::NetStrengthSyntax>
                         ((NetStrengthSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  TVar3 = parsing::Token::deepClone((Token *)in_stack_000000c0,in_stack_000000b8);
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x81e4be);
  deepClone<slang::syntax::DataTypeSyntax>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (*(long *)(__fn + 0x80) != 0) {
    deepClone<slang::syntax::TimingControlSyntax>
              ((TimingControlSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  deepClone<slang::syntax::DeclaratorSyntax>(in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone((Token *)in_stack_000000c0,in_stack_000000b8);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NetStrengthSyntax*,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::TimingControlSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,TVar2._0_8_,
                      (NetStrengthSyntax **)local_68,(Token *)TVar3.info,TVar3._0_8_,
                      in_stack_00000010,in_stack_00000018,(Token *)in_stack_00000020);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NetDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NetDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.netType.deepClone(alloc),
        node.strength ? deepClone(*node.strength, alloc) : nullptr,
        node.expansionHint.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        node.delay ? deepClone(*node.delay, alloc) : nullptr,
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}